

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:57:51),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:57:51),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<unsigned_long> *pEVar1;
  unsigned_long *in_00;
  unsigned_long local_5e8;
  ExceptionOr<unsigned_long> local_5e0;
  unsigned_long *local_470;
  unsigned_long *depValue;
  ExceptionOr<unsigned_long> local_310;
  Exception *local_1a0;
  Exception *depException;
  undefined1 local_188 [8];
  ExceptionOr<unsigned_long> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:57:51),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)output;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)local_188);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_188);
  local_1a0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
  if (local_1a0 == (Exception *)0x0) {
    local_470 = readMaybe<unsigned_long>
                          ((Maybe<unsigned_long> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_470 != (unsigned_long *)0x0) {
      in_00 = mv<unsigned_long>(local_470);
      local_5e8 = MaybeVoidCaller<unsigned_long,unsigned_long>::
                  apply<kj::AsyncInputStream::read(void*,unsigned_long,unsigned_long)::__0>
                            (&this->func,in_00);
      handle(&local_5e0,this,&local_5e8);
      pEVar1 = ExceptionOrValue::as<unsigned_long>((ExceptionOrValue *)depResult.value.ptr.field_1);
      ExceptionOr<unsigned_long>::operator=(pEVar1,&local_5e0);
      ExceptionOr<unsigned_long>::~ExceptionOr(&local_5e0);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x30,in)
    ;
    handle(&local_310,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<unsigned_long>((ExceptionOrValue *)depResult.value.ptr.field_1);
    ExceptionOr<unsigned_long>::operator=(pEVar1,&local_310);
    ExceptionOr<unsigned_long>::~ExceptionOr(&local_310);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<unsigned_long>::~ExceptionOr((ExceptionOr<unsigned_long> *)local_188);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }